

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-array.hpp
# Opt level: O0

void __thiscall baryonyx::fixed_array<int>::fixed_array(fixed_array<int> *this,fixed_array<int> *o)

{
  size_type __n;
  int *__first;
  int *__result;
  fixed_array<int> *o_local;
  fixed_array<int> *this_local;
  
  std::make_unique<int[]>((size_t)this);
  this->m_length = o->m_length;
  __first = data(o);
  __n = size(o);
  __result = data(this);
  std::copy_n<int_const*,unsigned_int,int*>(__first,__n,__result);
  return;
}

Assistant:

fixed_array<T>::fixed_array(const fixed_array& o)
  : m_buffer{ std::make_unique<T[]>(o.m_length) }
  , m_length{ o.m_length }
{
    std::copy_n(o.data(), o.size(), data());
}